

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O3

bool __thiscall
iDynTree::ModelLoader::loadModelFromFile
          (ModelLoader *this,string *filename,string *param_2,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageDirs)

{
  _Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false> _Var1;
  long lVar2;
  pointer pcVar3;
  XMLParser *pXVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar5;
  undefined1 *puVar6;
  URDFDocument *this_01;
  Model *pMVar7;
  bool bVar8;
  shared_ptr<iDynTree::XMLParser> parser;
  shared_ptr<const_iDynTree::XMLDocument> document;
  ModelParserOptions parserOptions;
  anon_class_40_1_197c2f9f documentFactoryWithOptions;
  XMLParser *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  undefined1 local_c0 [8];
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  undefined1 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  undefined1 local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_e0 = (XMLParser *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::XMLParser,std::allocator<iDynTree::XMLParser>>
            (&local_d8,&local_e0,(allocator<iDynTree::XMLParser> *)local_c0);
  _Var1._M_head_impl =
       (this->m_pimpl)._M_t.
       super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
       .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>._M_head_impl;
  local_c0[0] = ((_Var1._M_head_impl)->m_options).addSensorFramesAsAdditionalFrames;
  local_b8 = local_a8;
  lVar2 = *(long *)&((string *)((long)&(_Var1._M_head_impl)->m_options + 8))->_M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,lVar2,
             *(size_type *)((long)&(_Var1._M_head_impl)->m_options + 0x10) + lVar2);
  local_78 = local_c0[0];
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b8,local_b0 + (long)local_b8);
  pXVar4 = local_e0;
  local_98 = (undefined1 *)0x0;
  uStack_90 = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  puVar6 = (undefined1 *)operator_new(0x28);
  *puVar6 = local_78;
  *(undefined1 **)(puVar6 + 8) = puVar6 + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar6 + 8),local_70,local_68 + (long)local_70);
  pcStack_80 = std::
               _Function_handler<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/ModelLoader.cpp:85:43)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/ModelLoader.cpp:85:43)>
             ::_M_manager;
  local_98 = puVar6;
  iDynTree::XMLParser::setDocumentFactory(pXVar4);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  iDynTree::XMLParser::setPackageDirs((vector *)local_e0);
  pXVar4 = local_e0;
  pcVar3 = (filename->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + filename->_M_string_length);
  cVar5 = iDynTree::XMLParser::parseXMLFile(pXVar4,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (cVar5 == '\0') {
    iDynTree::reportError("ModelLoader","loadModelFromFile","Error in parsing model from URDF.");
    bVar8 = false;
    goto LAB_001241a9;
  }
  iDynTree::XMLParser::document();
  if (local_d0 == 0) {
LAB_0012414b:
    iDynTree::reportError
              ("ModelLoader","loadModelFromFile","Fatal error in retrieving the parsed model.");
    bVar8 = false;
  }
  else {
    this_01 = (URDFDocument *)
              __dynamic_cast(local_d0,&XMLDocument::typeinfo,&URDFDocument::typeinfo,0);
    this_00 = local_c8;
    if (this_01 == (URDFDocument *)0x0) goto LAB_0012414b;
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_c8->_M_use_count = local_c8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_c8->_M_use_count = local_c8->_M_use_count + 1;
      }
    }
    _Var1._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
         .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>._M_head_impl;
    pMVar7 = URDFDocument::model(this_01);
    iDynTree::Model::operator=(&(_Var1._M_head_impl)->m_model,pMVar7);
    *(Model *)&(_Var1._M_head_impl)->m_isModelValid = (Model)0x1;
    bVar8 = true;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
LAB_001241a9:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  return bVar8;
}

Assistant:

bool ModelLoader::loadModelFromFile(const std::string& filename,
                                        const std::string& /*filetype*/,
                                        const std::vector<std::string>& packageDirs /* = {} */)
    {
        // Allocate parser
        std::shared_ptr<XMLParser> parser = std::make_shared<XMLParser>();
        auto parserOptions =  this->m_pimpl->m_options;
        auto documentFactoryWithOptions = [parserOptions](XMLParserState& state){
            return std::shared_ptr<XMLDocument>(new URDFDocument(state, parserOptions));
            };
        parser->setDocumentFactory(documentFactoryWithOptions);
        parser->setPackageDirs(packageDirs);
        if (!parser->parseXMLFile(filename)) {
            reportError("ModelLoader", "loadModelFromFile", "Error in parsing model from URDF.");
            return false;
        }
        // Retrieving the parsed document, which is an instance of URDFDocument
        std::shared_ptr<const XMLDocument> document = parser->document();
        std::shared_ptr<const URDFDocument> urdfDocument = std::dynamic_pointer_cast<const URDFDocument>(document);
        if (!urdfDocument) {
            reportError("ModelLoader", "loadModelFromFile", "Fatal error in retrieving the parsed model.");
            return false;
        }

        return m_pimpl->setModel(urdfDocument->model());
    }